

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::verifyInvalidOperationErrors
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture)

{
  GLenum GVar1;
  int local_38;
  bool local_31;
  GLint immutableFormat;
  bool result;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureCommitmentTestCase *this_local;
  
  _immutableFormat = texture;
  texture_local._0_4_ = format;
  texture_local._4_4_ = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  std::operator<<((ostream *)&this->field_0x88,"Verify INVALID_OPERATION Errors - ");
  local_31 = true;
  gl4cts::Texture::Generate(_format_local,_immutableFormat);
  gl4cts::Texture::Bind(_format_local,*_immutableFormat,texture_local._4_4_);
  (*_format_local->texParameteri)(texture_local._4_4_,0x91a6,1);
  GVar1 = (*_format_local->getError)();
  glu::checkError(GVar1,"texParameteri error occurred for GL_TEXTURE_SPARSE_ARB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0x89d);
  (*_format_local->getTexParameteriv)(texture_local._4_4_,0x912f,&local_38);
  GVar1 = (*_format_local->getError)();
  glu::checkError(GVar1,"getTexParameteriv error occurred for GL_TEXTURE_IMMUTABLE_FORMAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0x8a2);
  if (local_38 == 0) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,
               _immutableFormat,0,0,0,0,(this->mState).pageSizeX,(this->mState).pageSizeY,
               (this->mState).pageSizeZ,1);
    GVar1 = (*_format_local->getError)();
    local_31 = SparseTextureUtils::verifyError
                         (&this->mLog,"texPageCommitment [GL_TEXTURE_IMMUTABLE_FORMAT texture]",
                          GVar1,0x502);
    if (!local_31) goto LAB_0118b3dc;
  }
  gl4cts::Texture::Delete(_format_local,_immutableFormat);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
            (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,
             _immutableFormat,1);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,
             _immutableFormat,0,0,0,0,(this->mState).pageSizeX,(this->mState).pageSizeY,
             (this->mState).pageSizeZ,1);
  GVar1 = (*_format_local->getError)();
  local_31 = SparseTextureUtils::verifyError
                       (&this->mLog,"texPageCommitment [not TEXTURE_SPARSE_ARB texture]",GVar1,0x502
                       );
  if (local_31) {
    gl4cts::Texture::Delete(_format_local,_immutableFormat);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
              (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,
               _immutableFormat,1);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,
               _immutableFormat,0,0,0,0,(this->mState).width + (this->mState).pageSizeX,
               (this->mState).height,(this->mState).depth,1);
    GVar1 = (*_format_local->getError)();
    local_31 = SparseTextureUtils::verifyError
                         (&this->mLog,"texPageCommitment [commitment width greater than expected]",
                          GVar1,0x502);
    if (local_31) {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,
                 _immutableFormat,0,0,0,0,(this->mState).width,
                 (this->mState).height + (this->mState).pageSizeY,(this->mState).depth,1);
      GVar1 = (*_format_local->getError)();
      local_31 = SparseTextureUtils::verifyError
                           (&this->mLog,
                            "texPageCommitment [commitment height greater than expected]",GVar1,
                            0x502);
      if (local_31) {
        if (((texture_local._4_4_ == 0x806f) || (texture_local._4_4_ == 0x8c1a)) ||
           (texture_local._4_4_ == 0x9009)) {
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,
                     _immutableFormat,0,0,0,0,(this->mState).width,(this->mState).height,
                     (this->mState).depth + (this->mState).pageSizeZ,1);
          GVar1 = (*_format_local->getError)();
          local_31 = SparseTextureUtils::verifyError
                               (&this->mLog,
                                "texPageCommitment [commitment depth greater than expected]",GVar1,
                                0x502);
          if (!local_31) goto LAB_0118b3dc;
        }
        if (1 < (this->mState).pageSizeX) {
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,
                     _immutableFormat,0,0,0,0,1,(this->mState).pageSizeY,(this->mState).pageSizeZ,1)
          ;
          GVar1 = (*_format_local->getError)();
          local_31 = SparseTextureUtils::verifyError
                               (&this->mLog,
                                "texPageCommitment [commitment width not multiple of page sizes X]",
                                GVar1,0x502);
          if (!local_31) goto LAB_0118b3dc;
        }
        if (1 < (this->mState).pageSizeY) {
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,
                     _immutableFormat,0,0,0,0,(this->mState).pageSizeX,1,(this->mState).pageSizeZ,1)
          ;
          GVar1 = (*_format_local->getError)();
          local_31 = SparseTextureUtils::verifyError
                               (&this->mLog,
                                "texPageCommitment [commitment height not multiple of page sizes Y]"
                                ,GVar1,0x502);
          if (!local_31) goto LAB_0118b3dc;
        }
        if ((1 < (this->mState).pageSizeZ) &&
           (((texture_local._4_4_ == 0x806f || (texture_local._4_4_ == 0x8c1a)) ||
            (texture_local._4_4_ == 0x9009)))) {
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                    (this,_format_local,(ulong)texture_local._4_4_,(ulong)(uint)texture_local,
                     _immutableFormat,0,0,0,0,(this->mState).pageSizeX,(this->mState).pageSizeY,
                     (this->mState).minDepth,1);
          GVar1 = (*_format_local->getError)();
          local_31 = SparseTextureUtils::verifyError
                               (&this->mLog,
                                "texPageCommitment [commitment depth not multiple of page sizes Z]",
                                GVar1,0x502);
        }
      }
    }
  }
LAB_0118b3dc:
  gl4cts::Texture::Delete(_format_local,_immutableFormat);
  return (bool)(local_31 & 1);
}

Assistant:

bool SparseTextureCommitmentTestCase::verifyInvalidOperationErrors(const Functions& gl, GLint target, GLint format,
																   GLuint& texture)
{
	mLog << "Verify INVALID_OPERATION Errors - ";

	bool result = true;

	// Case 1 - texture is not GL_TEXTURE_IMMUTABLE_FORMAT
	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texParameteri error occurred for GL_TEXTURE_SPARSE_ARB");

	GLint immutableFormat;

	gl.getTexParameteriv(target, GL_TEXTURE_IMMUTABLE_FORMAT, &immutableFormat);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getTexParameteriv error occurred for GL_TEXTURE_IMMUTABLE_FORMAT");

	if (immutableFormat == GL_FALSE)
	{
		texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ,
						  GL_TRUE);
		result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [GL_TEXTURE_IMMUTABLE_FORMAT texture]",
												 gl.getError(), GL_INVALID_OPERATION);
		if (!result)
			goto verifing_invalid_operation_end;
	}

	Texture::Delete(gl, texture);

	// Case 2 - texture is not TEXTURE_SPARSE_ARB
	allocateTexture(gl, target, format, texture, 1);

	texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ,
					  GL_TRUE);
	result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [not TEXTURE_SPARSE_ARB texture]", gl.getError(),
											 GL_INVALID_OPERATION);
	if (!result)
		goto verifing_invalid_operation_end;

	// Sparse allocate texture
	Texture::Delete(gl, texture);
	sparseAllocateTexture(gl, target, format, texture, 1);

	// Case 3 - commitment sizes greater than expected
	texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.width + mState.pageSizeX, mState.height,
					  mState.depth, GL_TRUE);
	result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment width greater than expected]",
											 gl.getError(), GL_INVALID_OPERATION);
	if (!result)
		goto verifing_invalid_operation_end;

	texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.width, mState.height + mState.pageSizeY,
					  mState.depth, GL_TRUE);
	result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment height greater than expected]",
											 gl.getError(), GL_INVALID_OPERATION);
	if (!result)
		goto verifing_invalid_operation_end;

	if (target == GL_TEXTURE_3D || target == GL_TEXTURE_2D_ARRAY || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.width, mState.height,
						  mState.depth + mState.pageSizeZ, GL_TRUE);
		result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment depth greater than expected]",
												 gl.getError(), GL_INVALID_OPERATION);
		if (!result)
			goto verifing_invalid_operation_end;
	}

	// Case 4 - commitment sizes not multiple of corresponding page sizes
	if (mState.pageSizeX > 1)
	{
		texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, 1, mState.pageSizeY, mState.pageSizeZ, GL_TRUE);
		result =
			SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment width not multiple of page sizes X]",
											gl.getError(), GL_INVALID_OPERATION);
		if (!result)
			goto verifing_invalid_operation_end;
	}

	if (mState.pageSizeY > 1)
	{
		texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.pageSizeX, 1, mState.pageSizeZ, GL_TRUE);
		result =
			SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment height not multiple of page sizes Y]",
											gl.getError(), GL_INVALID_OPERATION);
		if (!result)
			goto verifing_invalid_operation_end;
	}

	if (mState.pageSizeZ > 1)
	{
		if (target == GL_TEXTURE_3D || target == GL_TEXTURE_2D_ARRAY || target == GL_TEXTURE_CUBE_MAP_ARRAY)
		{
			texPageCommitment(gl, target, format, texture, 0, 0, 0, 0, mState.pageSizeX, mState.pageSizeY,
							  mState.minDepth, GL_TRUE);
			result = SparseTextureUtils::verifyError(
				mLog, "texPageCommitment [commitment depth not multiple of page sizes Z]", gl.getError(),
				GL_INVALID_OPERATION);
			if (!result)
				goto verifing_invalid_operation_end;
		}
	}

verifing_invalid_operation_end:

	Texture::Delete(gl, texture);

	return result;
}